

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::Interpreter::instantiate
          (Result<wasm::Ok> *__return_storage_ptr__,Interpreter *this,Instance *instance)

{
  element_type *peVar1;
  pointer puVar2;
  undefined1 other [8];
  mapped_type *this_00;
  pointer puVar3;
  undefined1 local_50 [8];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> results;
  
  peVar1 = (instance->wasm).super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar3 = (peVar1->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            ((long)&(peVar1->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  if (puVar3 != puVar2) {
    results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)instance;
    do {
      interpreter::ExpressionIterator::ExpressionIterator
                ((ExpressionIterator *)local_50,
                 *(Expression **)
                  ((long)(puVar3->_M_t).
                         super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                  + 0x40));
      std::vector<wasm::interpreter::Frame,std::allocator<wasm::interpreter::Frame>>::
      emplace_back<wasm::interpreter::Instance&,wasm::interpreter::ExpressionIterator>
                ((vector<wasm::interpreter::Frame,std::allocator<wasm::interpreter::Frame>> *)this,
                 (Instance *)
                 results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(ExpressionIterator *)local_50);
      if (local_50 != (undefined1  [8])0x0) {
        operator_delete((void *)local_50,
                        (long)results.
                              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_50);
      }
      run((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_50,this);
      other = local_50;
      if ((long)results.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_50 != 0x18) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/interpreter/interpreter.cpp"
                      ,0x124,"Result<> wasm::Interpreter::instantiate(Instance &)");
      }
      this_00 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literal>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literal>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literal>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literal>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&instance->globalValues,
                             (key_type *)
                             (puVar3->_M_t).
                             super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            );
      Literal::operator=(this_00,(Literal *)other);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)local_50);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<> Interpreter::instantiate(Instance& instance) {
  for (auto& global : instance.wasm->globals) {
    store.callStack.emplace_back(instance, ExpressionIterator(global->init));
    auto results = run();
    assert(results.size() == 1);
    instance.globalValues[global->name] = results[0];
  }
  return Ok{};
}